

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opl_mus_player.cpp
# Opt level: O3

void __thiscall OPLmusicFile::Restart(OPLmusicFile *this)

{
  musicBlock *this_00;
  BYTE *pBVar1;
  BYTE *pBVar2;
  int iVar3;
  
  this_00 = &(this->super_OPLmusicBlock).super_musicBlock;
  musicBlock::OPLstopMusic(this_00);
  musicBlock::OPLplayMusic(this_00,0x7f);
  (this->super_OPLmusicBlock).super_musicBlock.MLtime = 0;
  (this->super_OPLmusicBlock).super_musicBlock.playingcount = 0;
  (this->super_OPLmusicBlock).LastOffset = 0.0;
  this->WhichChip = 0;
  switch(this->RawPlayer) {
  case RDosPlay:
    pBVar1 = (this->super_OPLmusicBlock).super_musicBlock.scoredata;
    (this->super_OPLmusicBlock).super_musicBlock.score = pBVar1 + 10;
    (this->super_OPLmusicBlock).SamplesPerTick =
         (double)*(ushort *)(pBVar1 + 8) * 0.041666666666666664;
    break;
  case IMF:
    iVar3 = 2;
    pBVar1 = (this->super_OPLmusicBlock).super_musicBlock.scoredata + 6;
    do {
      do {
        pBVar2 = pBVar1;
        pBVar1 = pBVar2 + 1;
        this_00->score = pBVar1;
      } while (*pBVar2 != '\0');
      iVar3 = iVar3 + -1;
    } while (iVar3 != 0);
    this_00->score = pBVar2 + 2;
    if (*(int *)(pBVar2 + 2) != 0) {
      this_00->score = pBVar2 + 6;
    }
    break;
  case DosBox1:
    pBVar1 = (this->super_OPLmusicBlock).super_musicBlock.scoredata + 0x18;
    goto LAB_0033668a;
  case DosBox2:
    pBVar1 = (this->super_OPLmusicBlock).super_musicBlock.scoredata;
    pBVar1 = pBVar1 + (ulong)pBVar1[0x19] + 0x1a;
LAB_0033668a:
    (this->super_OPLmusicBlock).super_musicBlock.score = pBVar1;
    (this->super_OPLmusicBlock).SamplesPerTick = 49.716;
  }
  (*((this->super_OPLmusicBlock).super_musicBlock.io)->_vptr_OPLio[5])
            ((this->super_OPLmusicBlock).SamplesPerTick);
  return;
}

Assistant:

void OPLmusicFile::Restart ()
{
	OPLmusicBlock::Restart();
	WhichChip = 0;
	switch (RawPlayer)
	{
	case RDosPlay:
		score = scoredata + 10;
		SamplesPerTick = LittleShort(*(WORD *)(scoredata + 8)) / ADLIB_CLOCK_MUL;
		break;

	case DosBox1:
		score = scoredata + 24;
		SamplesPerTick = OPL_SAMPLE_RATE / 1000;
		break;

	case DosBox2:
		score = scoredata + 0x1A + scoredata[0x19];
		SamplesPerTick = OPL_SAMPLE_RATE / 1000;
		break;

	case IMF:
		score = scoredata + 6;

		// Skip track and game name
		for (int i = 2; i != 0; --i)
		{
			while (*score++ != '\0') {}
		}
		score++;	// Skip unknown byte
		if (*(DWORD *)score != 0)
		{
			score += 4;		// Skip song length
		}
		break;
	}
	io->SetClockRate(SamplesPerTick);
}